

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

thread_ret_t ggml_graph_compute_thread(void *data)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = *(long *)((long)data + 0x30);
  iVar4 = *(int *)(lVar5 + 4);
  while( true ) {
    LOCK();
    piVar1 = (int *)(lVar5 + 8);
    iVar2 = *piVar1;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    if (iVar2 == iVar4 + -1) {
      LOCK();
      *(undefined1 *)(*(long *)((long)data + 0x30) + 0xc) = 0;
      UNLOCK();
    }
    else {
      while ((*(byte *)(*(long *)((long)data + 0x30) + 0xc) & 1) != 0) {
        if ((*(byte *)(*(long *)((long)data + 0x30) + 0xd) & 1) != 0) {
          return (thread_ret_t)0x0;
        }
      }
    }
    LOCK();
    piVar1 = (int *)(*(long *)((long)data + 0x30) + 8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    while (bVar3 = *(byte *)(*(long *)((long)data + 0x30) + 0xd),
          (*(byte *)(*(long *)((long)data + 0x30) + 0xc) & 1) == 0) {
      if ((bVar3 & 1) != 0) {
        return (thread_ret_t)0x0;
      }
    }
    if (((bVar3 & 1) != 0) || (*(ggml_tensor **)((long)data + 0x28) == (ggml_tensor *)0x0)) break;
    if (*(int *)((long)data + 0xc) < *(int *)((long)data + 0x10)) {
      ggml_compute_forward
                ((ggml_compute_params *)((long)data + 8),*(ggml_tensor **)((long)data + 0x28));
    }
    *(undefined8 *)((long)data + 0x28) = 0;
    lVar5 = *(long *)((long)data + 0x30);
  }
  return (thread_ret_t)0x0;
}

Assistant:

static thread_ret_t ggml_graph_compute_thread(void * data) {
    struct ggml_compute_state * state = (struct ggml_compute_state *) data;

    const int n_threads = state->shared->n_threads;

    while (true) {
        if (atomic_fetch_add(&state->shared->n_ready, 1) == n_threads - 1) {
            atomic_store(&state->shared->has_work, false);
        } else {
            while (atomic_load(&state->shared->has_work)) {
                if (atomic_load(&state->shared->stop)) {
                    return 0;
                }
                ggml_lock_lock  (&state->shared->spin);
                ggml_lock_unlock(&state->shared->spin);
            }
        }

        atomic_fetch_sub(&state->shared->n_ready, 1);

        // wait for work
        while (!atomic_load(&state->shared->has_work)) {
            if (atomic_load(&state->shared->stop)) {
                return 0;
            }
            ggml_lock_lock  (&state->shared->spin);
            ggml_lock_unlock(&state->shared->spin);
        }

        // check if we should stop
        if (atomic_load(&state->shared->stop)) {
            break;
        }

        if (state->node) {
            if (state->params.ith < state->params.nth) {
                ggml_compute_forward(&state->params, state->node);
            }

            state->node = NULL;
        } else {
            break;
        }
    }

    return 0;
}